

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

int Gia_ManFindChainStart(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int local_2c;
  int local_28;
  int DelayMax;
  int iMax;
  int i;
  int *pDelays;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  piVar2 = Vec_IntArray(p->vLevels);
  local_28 = -1;
  local_2c = 0;
  DelayMax = 0;
  while( true ) {
    bVar3 = false;
    if (DelayMax < p->nObjs) {
      pDelays = (int *)Gia_ManObj(p,DelayMax);
      bVar3 = (Gia_Obj_t *)pDelays != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pDelays);
    if (((iVar1 != 0) && (iVar1 = Gia_ObjIsUsed((Gia_Obj_t *)pDelays), iVar1 == 0)) &&
       (local_2c <= piVar2[DelayMax])) {
      local_2c = piVar2[DelayMax];
      local_28 = DelayMax;
    }
    DelayMax = DelayMax + 1;
  }
  return local_28;
}

Assistant:

int Gia_ManFindChainStart( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int * pDelays = Vec_IntArray(p->vLevels);
    int i, iMax = -1, DelayMax = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Gia_ObjIsUsed(pObj) )
            continue;
        if ( DelayMax > pDelays[i] )
            continue;
        DelayMax = pDelays[i];
        iMax = i;
    }
    return iMax;
}